

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHelper.h
# Opt level: O0

void __thiscall
FIX::ExeceptionStore::get
          (ExeceptionStore *this,int param_1,int param_2,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_3)

{
  IOException *this_00;
  allocator<char> local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *param_3_local;
  int param_2_local;
  int param_1_local;
  ExeceptionStore *this_local;
  
  local_20 = param_3;
  param_3_local._0_4_ = param_2;
  param_3_local._4_4_ = param_1;
  _param_2_local = this;
  this_00 = (IOException *)__cxa_allocate_exception(0x50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"get threw an IOException",&local_41);
  IOException::IOException(this_00,&local_40);
  __cxa_throw(this_00,&IOException::typeinfo,IOException::~IOException);
}

Assistant:

void get( int, int, std::vector < std::string > & ) const EXCEPT ( IOException ) {
    throw IOException("get threw an IOException");
  }